

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

void __thiscall
HighsCliqueTable::buildFrom(HighsCliqueTable *this,HighsLp *origModel,HighsCliqueTable *init)

{
  double dVar1;
  int iVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pdVar6;
  ulong uVar7;
  CliqueVar *pCVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pdVar11;
  CliqueVar *pCVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> clqBuffer;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> local_238;
  HighsCliqueTable *local_220;
  HighsCliqueTable local_218;
  
  HighsCliqueTable(&local_218,
                   (HighsInt)
                   ((ulong)((long)(init->colsubstituted).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(init->colsubstituted).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2));
  local_218.inPresolve = this->minEntriesForParallelism != 0;
  pCVar3 = (init->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar4 = (init->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_238.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_start = (CliqueVar *)0x0;
  local_238.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_finish = (CliqueVar *)0x0;
  local_238.
  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_220 = this;
  std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::reserve
            (&local_238,(long)origModel->num_col_ * 2);
  uVar7 = ((long)pCVar3 - (long)pCVar4 >> 2) * -0x3333333333333333;
  if ((int)uVar7 != 0) {
    uVar13 = 0;
    do {
      pCVar3 = (init->cliques).
               super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = pCVar3[uVar13].start;
      if (((long)iVar2 != -1) && (1 < pCVar3[uVar13].end - (pCVar3[uVar13].numZeroFixed + iVar2))) {
        pCVar5 = (init->cliqueentries).
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
        _M_assign_aux<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_const*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  ((vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>
                    *)&local_238,pCVar5 + iVar2,pCVar5 + pCVar3[uVar13].end);
        uVar9 = (long)local_238.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_238.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start;
        pCVar8 = local_238.
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (0 < (long)uVar9 >> 4) {
          pdVar11 = (origModel->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar10 = uVar9 & 0xfffffffffffffff0;
          lVar15 = ((long)uVar9 >> 4) + 1;
          pCVar8 = local_238.
                   super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
          do {
            if ((pdVar11[(uint)pCVar8[-2] & 0x7fffffff] != 0.0) ||
               (NAN(pdVar11[(uint)pCVar8[-2] & 0x7fffffff]))) {
LAB_00263c09:
              pCVar8 = pCVar8 + -2;
              goto LAB_00263c1c;
            }
            pdVar6 = (origModel->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((pdVar6[(uint)pCVar8[-2] & 0x7fffffff] != 1.0) ||
               (NAN(pdVar6[(uint)pCVar8[-2] & 0x7fffffff]))) goto LAB_00263c09;
            if ((((pdVar11[(uint)pCVar8[-1] & 0x7fffffff] != 0.0) ||
                 (NAN(pdVar11[(uint)pCVar8[-1] & 0x7fffffff]))) ||
                (pdVar6[(uint)pCVar8[-1] & 0x7fffffff] != 1.0)) ||
               (NAN(pdVar6[(uint)pCVar8[-1] & 0x7fffffff]))) {
              pCVar8 = pCVar8 + -1;
              goto LAB_00263c1c;
            }
            if (((pdVar11[(uint)*pCVar8 & 0x7fffffff] != 0.0) ||
                (NAN(pdVar11[(uint)*pCVar8 & 0x7fffffff]))) ||
               ((pdVar6[(uint)*pCVar8 & 0x7fffffff] != 1.0 ||
                (NAN(pdVar6[(uint)*pCVar8 & 0x7fffffff]))))) goto LAB_00263c1c;
            if (((pdVar11[(uint)pCVar8[1] & 0x7fffffff] != 0.0) ||
                (NAN(pdVar11[(uint)pCVar8[1] & 0x7fffffff]))) ||
               ((pdVar6[(uint)pCVar8[1] & 0x7fffffff] != 1.0 ||
                (NAN(pdVar6[(uint)pCVar8[1] & 0x7fffffff]))))) {
              pCVar8 = pCVar8 + 1;
              goto LAB_00263c1c;
            }
            lVar15 = lVar15 + -1;
            pCVar8 = pCVar8 + 4;
          } while (1 < lVar15);
          uVar9 = (long)local_238.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(&(local_238.
                           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                           ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + uVar10);
          pCVar8 = (CliqueVar *)
                   (&(local_238.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + uVar10);
        }
        lVar15 = (long)uVar9 >> 2;
        if (lVar15 == 3) {
          pdVar11 = (origModel->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((((pdVar11[(uint)*pCVar8 & 0x7fffffff] == 0.0) &&
               (!NAN(pdVar11[(uint)*pCVar8 & 0x7fffffff]))) &&
              (dVar1 = (origModel->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[(uint)*pCVar8 & 0x7fffffff],
              dVar1 == 1.0)) && (!NAN(dVar1))) {
            pCVar8 = pCVar8 + 1;
            goto LAB_00263cd6;
          }
LAB_00263c1c:
          pCVar12 = pCVar8 + 1;
          if (pCVar12 !=
              local_238.
              super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
              ._M_impl.super__Vector_impl_data._M_finish &&
              pCVar8 != local_238.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            do {
              uVar14 = (uint)*pCVar12 & 0x7fffffff;
              dVar1 = (origModel->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar14];
              if ((((dVar1 == 0.0) && (!NAN(dVar1))) &&
                  (dVar1 = (origModel->col_upper_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar14], dVar1 == 1.0)) && (!NAN(dVar1))
                 ) {
                *pCVar8 = *pCVar12;
                pCVar8 = pCVar8 + 1;
              }
              pCVar12 = pCVar12 + 1;
            } while (pCVar12 !=
                     local_238.
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
          }
          if (pCVar8 != local_238.
                        super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            local_238.
            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
            ._M_impl.super__Vector_impl_data._M_finish = pCVar8;
          }
        }
        else {
          if (lVar15 == 2) {
            pdVar11 = (origModel->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
LAB_00263cd6:
            if (((pdVar11[(uint)*pCVar8 & 0x7fffffff] == 0.0) &&
                (!NAN(pdVar11[(uint)*pCVar8 & 0x7fffffff]))) &&
               ((dVar1 = (origModel->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[(uint)*pCVar8 & 0x7fffffff],
                dVar1 == 1.0 && (!NAN(dVar1))))) {
              pCVar8 = pCVar8 + 1;
              goto LAB_00263be0;
            }
            goto LAB_00263c1c;
          }
          if (lVar15 == 1) {
            pdVar11 = (origModel->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
LAB_00263be0:
            if (((pdVar11[(uint)*pCVar8 & 0x7fffffff] != 0.0) ||
                (NAN(pdVar11[(uint)*pCVar8 & 0x7fffffff]))) ||
               ((dVar1 = (origModel->col_upper_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start[(uint)*pCVar8 & 0x7fffffff],
                dVar1 != 1.0 || (NAN(dVar1))))) goto LAB_00263c1c;
          }
        }
        uVar9 = (long)local_238.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_238.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 2;
        if (1 < uVar9) {
          doAddClique(&local_218,
                      local_238.
                      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                      ._M_impl.super__Vector_impl_data._M_start,(HighsInt)uVar9,false,
                      (uint)((init->cliques).
                             super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar13].origin != 0x7fffffff)
                      << 0x1f | 0x7fffffff);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uVar7 & 0xffffffff));
  }
  std::vector<int,_std::allocator<int>_>::operator=(&local_218.colsubstituted,&init->colsubstituted)
  ;
  std::vector<HighsCliqueTable::Substitution,_std::allocator<HighsCliqueTable::Substitution>_>::
  operator=(&local_218.substitutions,&init->substitutions);
  operator=(local_220,&local_218);
  if (local_238.
      super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>.
      _M_impl.super__Vector_impl_data._M_start != (CliqueVar *)0x0) {
    operator_delete(local_238.
                    super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ~HighsCliqueTable(&local_218);
  return;
}

Assistant:

void HighsCliqueTable::buildFrom(const HighsLp* origModel,
                                 const HighsCliqueTable& init) {
  assert(init.colsubstituted.size() == colsubstituted.size());
  HighsInt ncols = init.colsubstituted.size();
  HighsCliqueTable newCliqueTable(ncols);
  newCliqueTable.setPresolveFlag(inPresolve);
  newCliqueTable.setPresolveFlag(minEntriesForParallelism);
  HighsInt ncliques = init.cliques.size();
  std::vector<CliqueVar> clqBuffer;
  clqBuffer.reserve(2 * static_cast<size_t>(origModel->num_col_));
  for (HighsInt i = 0; i != ncliques; ++i) {
    if (init.cliques[i].start == -1) continue;

    HighsInt numvars = init.cliques[i].end - init.cliques[i].start;

    if (numvars - init.cliques[i].numZeroFixed <= 1) continue;

    clqBuffer.assign(init.cliqueentries.begin() + init.cliques[i].start,
                     init.cliqueentries.begin() + init.cliques[i].end);
    clqBuffer.erase(std::remove_if(clqBuffer.begin(), clqBuffer.end(),
                                   [origModel](CliqueVar v) {
                                     return origModel->col_lower_[v.col] !=
                                                0.0 ||
                                            origModel->col_upper_[v.col] != 1.0;
                                   }),
                    clqBuffer.end());
    if (clqBuffer.size() <= 1) continue;

    HighsInt origin = init.cliques[i].origin != kHighsIInf ? -1 : kHighsIInf;
    newCliqueTable.doAddClique(clqBuffer.data(), clqBuffer.size(), false,
                               origin);
  }

  newCliqueTable.colsubstituted = init.colsubstituted;
  newCliqueTable.substitutions = init.substitutions;
  *this = std::move(newCliqueTable);
}